

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# dynamic_integer_points_kd_tree_decoder.h
# Opt level: O1

bool __thiscall
draco::DynamicIntegerPointsKdTreeDecoder<1>::
DecodeInternal<draco::PointAttributeVectorOutputIterator<unsigned_int>>
          (DynamicIntegerPointsKdTreeDecoder<1> *this,uint32_t num_points,
          PointAttributeVectorOutputIterator<unsigned_int> *oit)

{
  PointIndex *pPVar1;
  vector<unsigned_int,_std::allocator<unsigned_int>_> *pvVar2;
  int *piVar3;
  pointer pvVar4;
  uint *puVar5;
  pointer puVar6;
  pointer puVar7;
  bool bVar8;
  byte bVar9;
  uint uVar10;
  uint32_t uVar11;
  _Elt_pointer pDVar12;
  ulong uVar13;
  ulong uVar14;
  pointer pvVar15;
  uint uVar16;
  ulong uVar17;
  PointAttributeVectorOutputIterator<unsigned_int> *pPVar18;
  int iVar19;
  uint32_t uVar20;
  uint32_t uVar21;
  uint uVar22;
  uint32_t uVar23;
  bool bVar24;
  uint32_t number;
  DecodingStatus init_status;
  stack<draco::DynamicIntegerPointsKdTreeDecoder<1>::DecodingStatus,_std::deque<draco::DynamicIntegerPointsKdTreeDecoder<1>::DecodingStatus,_std::allocator<draco::DynamicIntegerPointsKdTreeDecoder<1>::DecodingStatus>_>_>
  status_stack;
  bool local_e9;
  uint local_e8;
  DecodingStatus local_dc;
  ulong local_d0;
  uint32_t local_c8;
  uint32_t local_c4;
  PointAttributeVectorOutputIterator<unsigned_int> *local_c0;
  DecodingStatus local_b8;
  uint32_t local_ac;
  _Deque_base<draco::DynamicIntegerPointsKdTreeDecoder<1>::DecodingStatus,_std::allocator<draco::DynamicIntegerPointsKdTreeDecoder<1>::DecodingStatus>_>
  local_a8;
  ulong local_50;
  DirectBitDecoder *local_48;
  VectorUint32 *local_40;
  DirectBitDecoder *local_38;
  
  local_b8.num_remaining_points = 0;
  local_c8 = num_points;
  std::vector<unsigned_int,_std::allocator<unsigned_int>_>::vector
            ((vector<unsigned_int,_std::allocator<unsigned_int>_> *)&local_a8,
             (ulong)this->dimension_,&local_b8.num_remaining_points,(allocator_type *)&local_dc);
  std::vector<unsigned_int,_std::allocator<unsigned_int>_>::_M_move_assign
            ((this->base_stack_).
             super__Vector_base<std::vector<unsigned_int,_std::allocator<unsigned_int>_>,_std::allocator<std::vector<unsigned_int,_std::allocator<unsigned_int>_>_>_>
             ._M_impl.super__Vector_impl_data._M_start,&local_a8);
  if (local_a8._M_impl.super__Deque_impl_data._M_map != (_Map_pointer)0x0) {
    operator_delete(local_a8._M_impl.super__Deque_impl_data._M_map,
                    (long)local_a8._M_impl.super__Deque_impl_data._M_start._M_cur -
                    (long)local_a8._M_impl.super__Deque_impl_data._M_map);
  }
  local_b8.num_remaining_points = 0;
  std::vector<unsigned_int,_std::allocator<unsigned_int>_>::vector
            ((vector<unsigned_int,_std::allocator<unsigned_int>_> *)&local_a8,
             (ulong)this->dimension_,&local_b8.num_remaining_points,(allocator_type *)&local_dc);
  std::vector<unsigned_int,_std::allocator<unsigned_int>_>::_M_move_assign
            ((this->levels_stack_).
             super__Vector_base<std::vector<unsigned_int,_std::allocator<unsigned_int>_>,_std::allocator<std::vector<unsigned_int,_std::allocator<unsigned_int>_>_>_>
             ._M_impl.super__Vector_impl_data._M_start);
  if (local_a8._M_impl.super__Deque_impl_data._M_map != (_Map_pointer)0x0) {
    operator_delete(local_a8._M_impl.super__Deque_impl_data._M_map,
                    (long)local_a8._M_impl.super__Deque_impl_data._M_start._M_cur -
                    (long)local_a8._M_impl.super__Deque_impl_data._M_map);
  }
  local_b8.num_remaining_points = local_c8;
  local_b8.last_axis = 0;
  local_b8.stack_pos = 0;
  local_a8._M_impl.super__Deque_impl_data._M_finish._M_last = (_Elt_pointer)0x0;
  local_a8._M_impl.super__Deque_impl_data._M_finish._M_node = (_Map_pointer)0x0;
  local_a8._M_impl.super__Deque_impl_data._M_finish._M_cur = (_Elt_pointer)0x0;
  local_a8._M_impl.super__Deque_impl_data._M_finish._M_first = (_Elt_pointer)0x0;
  local_a8._M_impl.super__Deque_impl_data._M_start._M_last = (_Elt_pointer)0x0;
  local_a8._M_impl.super__Deque_impl_data._M_start._M_node = (_Map_pointer)0x0;
  local_a8._M_impl.super__Deque_impl_data._M_start._M_cur = (_Elt_pointer)0x0;
  local_a8._M_impl.super__Deque_impl_data._M_start._M_first = (_Elt_pointer)0x0;
  local_a8._M_impl.super__Deque_impl_data._M_map = (_Map_pointer)0x0;
  local_a8._M_impl.super__Deque_impl_data._M_map_size = 0;
  std::
  _Deque_base<draco::DynamicIntegerPointsKdTreeDecoder<1>::DecodingStatus,_std::allocator<draco::DynamicIntegerPointsKdTreeDecoder<1>::DecodingStatus>_>
  ::_M_initialize_map(&local_a8,0);
  if (local_a8._M_impl.super__Deque_impl_data._M_finish._M_cur ==
      local_a8._M_impl.super__Deque_impl_data._M_finish._M_last + -1) {
    std::
    deque<draco::DynamicIntegerPointsKdTreeDecoder<1>::DecodingStatus,std::allocator<draco::DynamicIntegerPointsKdTreeDecoder<1>::DecodingStatus>>
    ::_M_push_back_aux<draco::DynamicIntegerPointsKdTreeDecoder<1>::DecodingStatus_const&>
              ((deque<draco::DynamicIntegerPointsKdTreeDecoder<1>::DecodingStatus,std::allocator<draco::DynamicIntegerPointsKdTreeDecoder<1>::DecodingStatus>>
                *)&local_a8,&local_b8);
  }
  else {
    (local_a8._M_impl.super__Deque_impl_data._M_finish._M_cur)->stack_pos = local_b8.stack_pos;
    (local_a8._M_impl.super__Deque_impl_data._M_finish._M_cur)->num_remaining_points =
         local_b8.num_remaining_points;
    (local_a8._M_impl.super__Deque_impl_data._M_finish._M_cur)->last_axis = local_b8.last_axis;
    local_a8._M_impl.super__Deque_impl_data._M_finish._M_cur =
         local_a8._M_impl.super__Deque_impl_data._M_finish._M_cur + 1;
  }
  local_e9 = local_a8._M_impl.super__Deque_impl_data._M_finish._M_cur ==
             local_a8._M_impl.super__Deque_impl_data._M_start._M_cur;
  if (!local_e9) {
    local_48 = &this->numbers_decoder_;
    local_38 = &this->remaining_bits_decoder_;
    local_40 = &this->p_;
    local_c0 = oit;
    do {
      pDVar12 = local_a8._M_impl.super__Deque_impl_data._M_finish._M_cur;
      if (local_a8._M_impl.super__Deque_impl_data._M_finish._M_cur ==
          local_a8._M_impl.super__Deque_impl_data._M_finish._M_first) {
        pDVar12 = local_a8._M_impl.super__Deque_impl_data._M_finish._M_node[-1] + 0x2a;
      }
      uVar22 = pDVar12[-1].num_remaining_points;
      uVar20 = pDVar12[-1].last_axis;
      uVar10 = pDVar12[-1].stack_pos;
      uVar17 = (ulong)uVar10;
      if (local_a8._M_impl.super__Deque_impl_data._M_finish._M_cur ==
          local_a8._M_impl.super__Deque_impl_data._M_finish._M_first) {
        operator_delete(local_a8._M_impl.super__Deque_impl_data._M_finish._M_first,0x1f8);
        local_a8._M_impl.super__Deque_impl_data._M_finish._M_first =
             local_a8._M_impl.super__Deque_impl_data._M_finish._M_node[-1];
        local_a8._M_impl.super__Deque_impl_data._M_finish._M_last =
             local_a8._M_impl.super__Deque_impl_data._M_finish._M_first + 0x2a;
        local_a8._M_impl.super__Deque_impl_data._M_finish._M_cur =
             local_a8._M_impl.super__Deque_impl_data._M_finish._M_first + 0x29;
        local_a8._M_impl.super__Deque_impl_data._M_finish._M_node =
             local_a8._M_impl.super__Deque_impl_data._M_finish._M_node + -1;
      }
      else {
        local_a8._M_impl.super__Deque_impl_data._M_finish._M_cur =
             local_a8._M_impl.super__Deque_impl_data._M_finish._M_cur + -1;
      }
      pPVar18 = local_c0;
      if (local_c8 < uVar22) {
LAB_00143bf5:
        local_e8 = 1;
      }
      else {
        uVar16 = uVar20 + 1;
        if (this->dimension_ - 1 == uVar20) {
          uVar16 = 0;
        }
        if (this->dimension_ <= uVar16) goto LAB_00143bf5;
        pvVar4 = (this->base_stack_).
                 super__Vector_base<std::vector<unsigned_int,_std::allocator<unsigned_int>_>,_std::allocator<std::vector<unsigned_int,_std::allocator<unsigned_int>_>_>_>
                 ._M_impl.super__Vector_impl_data._M_start;
        pvVar2 = pvVar4 + uVar17;
        pvVar15 = (this->levels_stack_).
                  super__Vector_base<std::vector<unsigned_int,_std::allocator<unsigned_int>_>,_std::allocator<std::vector<unsigned_int,_std::allocator<unsigned_int>_>_>_>
                  ._M_impl.super__Vector_impl_data._M_start + uVar17;
        uVar14 = (ulong)uVar16;
        uVar20 = *(uint32_t *)
                  (*(long *)&(pvVar15->
                             super__Vector_base<unsigned_int,_std::allocator<unsigned_int>_>).
                             _M_impl.super__Vector_impl_data + uVar14 * 4);
        local_d0 = uVar17;
        if (this->bit_length_ == uVar20) {
          local_e8 = 0;
          if (uVar22 != 0) {
            do {
              PointAttributeVectorOutputIterator<unsigned_int>::operator=(pPVar18,pvVar2);
              pPVar1 = &pPVar18->point_id_;
              pPVar1->value_ = pPVar1->value_ + 1;
              this->num_decoded_points_ = this->num_decoded_points_ + 1;
              uVar22 = uVar22 - 1;
            } while (uVar22 != 0);
            local_e8 = 0;
          }
        }
        else if (uVar22 < 3) {
          puVar5 = (this->axes_).super__Vector_base<unsigned_int,_std::allocator<unsigned_int>_>.
                   _M_impl.super__Vector_impl_data._M_start;
          *puVar5 = uVar16;
          uVar14 = (ulong)this->dimension_;
          if (1 < this->dimension_) {
            uVar10 = *puVar5;
            uVar13 = 1;
            do {
              bVar24 = uVar10 == (int)uVar14 - 1U;
              uVar10 = uVar10 + 1;
              if (bVar24) {
                uVar10 = 0;
              }
              puVar5[uVar13] = uVar10;
              uVar13 = uVar13 + 1;
              uVar14 = (ulong)this->dimension_;
            } while (uVar13 < uVar14);
          }
          if (uVar22 != 0) {
            uVar10 = 0;
            do {
              local_d0 = CONCAT44(local_d0._4_4_,uVar10);
              bVar24 = this->dimension_ != 0;
              local_e8 = 0xd;
              if (bVar24) {
                uVar17 = 0;
                do {
                  puVar6 = (this->p_).
                           super__Vector_base<unsigned_int,_std::allocator<unsigned_int>_>._M_impl.
                           super__Vector_impl_data._M_start;
                  puVar7 = (this->axes_).
                           super__Vector_base<unsigned_int,_std::allocator<unsigned_int>_>._M_impl.
                           super__Vector_impl_data._M_start;
                  puVar6[puVar7[uVar17]] = 0;
                  uVar14 = (ulong)puVar7[uVar17];
                  iVar19 = this->bit_length_ -
                           *(int *)(*(long *)&(pvVar15->
                                              super__Vector_base<unsigned_int,_std::allocator<unsigned_int>_>
                                              )._M_impl.super__Vector_impl_data + uVar14 * 4);
                  if ((iVar19 != 0) &&
                     (bVar8 = DirectBitDecoder::DecodeLeastSignificantBits32
                                        (local_38,iVar19,puVar6 + uVar14), !bVar8)) {
                    pPVar18 = local_c0;
                    local_e8 = 1;
                    break;
                  }
                  uVar10 = (this->axes_).
                           super__Vector_base<unsigned_int,_std::allocator<unsigned_int>_>._M_impl.
                           super__Vector_impl_data._M_start[uVar17];
                  puVar5 = (this->p_).
                           super__Vector_base<unsigned_int,_std::allocator<unsigned_int>_>._M_impl.
                           super__Vector_impl_data._M_start + uVar10;
                  *puVar5 = *puVar5 | (pvVar2->
                                      super__Vector_base<unsigned_int,_std::allocator<unsigned_int>_>
                                      )._M_impl.super__Vector_impl_data._M_start[uVar10];
                  uVar17 = uVar17 + 1;
                  bVar24 = uVar17 < this->dimension_;
                  pPVar18 = local_c0;
                  local_e8 = 0xd;
                } while (bVar24);
              }
              if (bVar24) goto LAB_00143d39;
              PointAttributeVectorOutputIterator<unsigned_int>::operator=(pPVar18,local_40);
              (pPVar18->point_id_).value_ = (pPVar18->point_id_).value_ + 1;
              this->num_decoded_points_ = this->num_decoded_points_ + 1;
              uVar10 = (int)local_d0 + 1;
            } while (uVar10 != uVar22);
          }
          local_e8 = 10;
LAB_00143d39:
          if (local_e8 == 10) {
            local_e8 = 0;
          }
        }
        else {
          local_e8 = 1;
          if (this->num_decoded_points_ <= this->num_points_) {
            uVar17 = (ulong)(uVar10 + 1);
            local_ac = this->bit_length_;
            local_50 = uVar17;
            std::vector<unsigned_int,_std::allocator<unsigned_int>_>::operator=
                      (pvVar4 + uVar17,pvVar2);
            piVar3 = (int *)(*(long *)&(this->base_stack_).
                                       super__Vector_base<std::vector<unsigned_int,_std::allocator<unsigned_int>_>,_std::allocator<std::vector<unsigned_int,_std::allocator<unsigned_int>_>_>_>
                                       ._M_impl.super__Vector_impl_data._M_start[uVar17].
                                       super__Vector_base<unsigned_int,_std::allocator<unsigned_int>_>
                                       ._M_impl.super__Vector_impl_data + uVar14 * 4);
            *piVar3 = *piVar3 + (1 << ((char)local_ac + ~(byte)uVar20 & 0x1f));
            iVar19 = 0x1f;
            if (uVar22 != 0) {
              for (; uVar22 >> iVar19 == 0; iVar19 = iVar19 + -1) {
              }
            }
            local_c4 = 0;
            DirectBitDecoder::DecodeLeastSignificantBits32(local_48,iVar19,&local_c4);
            uVar13 = local_d0;
            uVar20 = (uVar22 >> 1) - local_c4;
            local_e8 = 1;
            if (local_c4 <= uVar22 >> 1) {
              uVar23 = uVar22 - uVar20;
              uVar21 = uVar20;
              if (uVar20 != uVar23) {
                puVar5 = (this->half_decoder_).pos_._M_current;
                if (puVar5 == (this->half_decoder_).bits_.
                              super__Vector_base<unsigned_int,_std::allocator<unsigned_int>_>.
                              _M_impl.super__Vector_impl_data._M_finish) {
                  bVar9 = 0;
                }
                else {
                  uVar11 = (this->half_decoder_).num_used_bits_;
                  bVar9 = (byte)((*puVar5 << ((byte)uVar11 & 0x1f)) >> 0x1f);
                  uVar11 = uVar11 + 1;
                  (this->half_decoder_).num_used_bits_ = uVar11;
                  if (uVar11 == 0x20) {
                    (this->half_decoder_).pos_._M_current = puVar5 + 1;
                    (this->half_decoder_).num_used_bits_ = 0;
                  }
                }
                if (bVar9 == 0) {
                  uVar21 = uVar23;
                  uVar23 = uVar20;
                }
              }
              pvVar4 = (this->levels_stack_).
                       super__Vector_base<std::vector<unsigned_int,_std::allocator<unsigned_int>_>,_std::allocator<std::vector<unsigned_int,_std::allocator<unsigned_int>_>_>_>
                       ._M_impl.super__Vector_impl_data._M_start;
              pvVar2 = pvVar4 + local_d0;
              puVar6 = (pvVar2->super__Vector_base<unsigned_int,_std::allocator<unsigned_int>_>).
                       _M_impl.super__Vector_impl_data._M_start + uVar14;
              *puVar6 = *puVar6 + 1;
              std::vector<unsigned_int,_std::allocator<unsigned_int>_>::operator=
                        (pvVar4 + uVar17,pvVar2);
              if (uVar21 != 0) {
                local_dc.num_remaining_points = uVar21;
                local_dc.last_axis = uVar16;
                local_dc.stack_pos = (uint32_t)uVar13;
                std::
                deque<draco::DynamicIntegerPointsKdTreeDecoder<1>::DecodingStatus,_std::allocator<draco::DynamicIntegerPointsKdTreeDecoder<1>::DecodingStatus>_>
                ::emplace_back<draco::DynamicIntegerPointsKdTreeDecoder<1>::DecodingStatus>
                          ((deque<draco::DynamicIntegerPointsKdTreeDecoder<1>::DecodingStatus,_std::allocator<draco::DynamicIntegerPointsKdTreeDecoder<1>::DecodingStatus>_>
                            *)&local_a8,&local_dc);
              }
              local_e8 = 0;
              if (uVar23 != 0) {
                local_dc.stack_pos = (uint32_t)local_50;
                local_dc.num_remaining_points = uVar23;
                local_dc.last_axis = uVar16;
                std::
                deque<draco::DynamicIntegerPointsKdTreeDecoder<1>::DecodingStatus,_std::allocator<draco::DynamicIntegerPointsKdTreeDecoder<1>::DecodingStatus>_>
                ::emplace_back<draco::DynamicIntegerPointsKdTreeDecoder<1>::DecodingStatus>
                          ((deque<draco::DynamicIntegerPointsKdTreeDecoder<1>::DecodingStatus,_std::allocator<draco::DynamicIntegerPointsKdTreeDecoder<1>::DecodingStatus>_>
                            *)&local_a8,&local_dc);
              }
            }
          }
        }
      }
    } while (((local_e8 & 0xd) == 0) &&
            (local_e9 = local_a8._M_impl.super__Deque_impl_data._M_finish._M_cur ==
                        local_a8._M_impl.super__Deque_impl_data._M_start._M_cur, !local_e9));
  }
  std::
  _Deque_base<draco::DynamicIntegerPointsKdTreeDecoder<1>::DecodingStatus,_std::allocator<draco::DynamicIntegerPointsKdTreeDecoder<1>::DecodingStatus>_>
  ::~_Deque_base(&local_a8);
  return local_e9;
}

Assistant:

bool DynamicIntegerPointsKdTreeDecoder<compression_level_t>::DecodeInternal(
    uint32_t num_points, OutputIteratorT &oit) {
  typedef DecodingStatus Status;
  base_stack_[0] = VectorUint32(dimension_, 0);
  levels_stack_[0] = VectorUint32(dimension_, 0);
  DecodingStatus init_status(num_points, 0, 0);
  std::stack<Status> status_stack;
  status_stack.push(init_status);

  // TODO(b/199760123): Use preallocated vector instead of stack.
  while (!status_stack.empty()) {
    const DecodingStatus status = status_stack.top();
    status_stack.pop();

    const uint32_t num_remaining_points = status.num_remaining_points;
    const uint32_t last_axis = status.last_axis;
    const uint32_t stack_pos = status.stack_pos;
    const VectorUint32 &old_base = base_stack_[stack_pos];
    const VectorUint32 &levels = levels_stack_[stack_pos];

    if (num_remaining_points > num_points) {
      return false;
    }

    const uint32_t axis = GetAxis(num_remaining_points, levels, last_axis);
    if (axis >= dimension_) {
      return false;
    }

    const uint32_t level = levels[axis];

    // All axes have been fully subdivided, just output points.
    if ((bit_length_ - level) == 0) {
      for (uint32_t i = 0; i < num_remaining_points; i++) {
        *oit = old_base;
        ++oit;
        ++num_decoded_points_;
      }
      continue;
    }

    DRACO_DCHECK_EQ(true, num_remaining_points != 0);

    // Fast decoding of remaining bits if number of points is 1 or 2.
    if (num_remaining_points <= 2) {
      // TODO(b/199760123): |axes_| not necessary, remove would change
      // bitstream!
      axes_[0] = axis;
      for (uint32_t i = 1; i < dimension_; i++) {
        axes_[i] = DRACO_INCREMENT_MOD(axes_[i - 1], dimension_);
      }
      for (uint32_t i = 0; i < num_remaining_points; ++i) {
        for (uint32_t j = 0; j < dimension_; j++) {
          p_[axes_[j]] = 0;
          const uint32_t num_remaining_bits = bit_length_ - levels[axes_[j]];
          if (num_remaining_bits) {
            if (!remaining_bits_decoder_.DecodeLeastSignificantBits32(
                    num_remaining_bits, &p_[axes_[j]])) {
              return false;
            }
          }
          p_[axes_[j]] = old_base[axes_[j]] | p_[axes_[j]];
        }
        *oit = p_;
        ++oit;
        ++num_decoded_points_;
      }
      continue;
    }

    if (num_decoded_points_ > num_points_) {
      return false;
    }

    const int num_remaining_bits = bit_length_ - level;
    const uint32_t modifier = 1 << (num_remaining_bits - 1);
    base_stack_[stack_pos + 1] = old_base;         // copy
    base_stack_[stack_pos + 1][axis] += modifier;  // new base

    const int incoming_bits = MostSignificantBit(num_remaining_points);

    uint32_t number = 0;
    DecodeNumber(incoming_bits, &number);

    uint32_t first_half = num_remaining_points / 2;
    if (first_half < number) {
      // Invalid |number|.
      return false;
    }
    first_half -= number;
    uint32_t second_half = num_remaining_points - first_half;

    if (first_half != second_half) {
      if (!half_decoder_.DecodeNextBit()) {
        std::swap(first_half, second_half);
      }
    }

    levels_stack_[stack_pos][axis] += 1;
    levels_stack_[stack_pos + 1] = levels_stack_[stack_pos];  // copy
    if (first_half) {
      status_stack.push(DecodingStatus(first_half, axis, stack_pos));
    }
    if (second_half) {
      status_stack.push(DecodingStatus(second_half, axis, stack_pos + 1));
    }
  }
  return true;
}